

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# header_list.cc
# Opt level: O1

Header * __thiscall
wave::HeaderList::Iterator::operator*(Header *__return_storage_ptr__,Iterator *this)

{
  (__return_storage_ptr__->id_)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->id_).field_2;
  (__return_storage_ptr__->id_)._M_string_length = 0;
  (__return_storage_ptr__->id_).field_2._M_local_buf[0] = '\0';
  Header::Init(__return_storage_ptr__,this->stream_,this->position_);
  return __return_storage_ptr__;
}

Assistant:

Header HeaderList::Iterator::operator*() {
  Header h;
  h.Init(stream_, position_);
  return h;
}